

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

void remove_dev(lys_deviation *dev,lys_module *module)

{
  char *__needle;
  lys_module *plVar1;
  lys_module *plVar2;
  char *pcVar3;
  size_t sVar4;
  LY_ERR *pLVar5;
  ulong uVar6;
  lys_deviation *plVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  uint32_t local_34 [2];
  uint32_t idx;
  
  local_34[0] = 0;
  if (dev->orig_node == (lys_node *)0x0) {
    pLVar5 = ly_errno_location();
    *pLVar5 = LY_EINT;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
           ,0x1080);
    return;
  }
  plVar1 = dev->orig_node->module;
  if ((plVar1->field_0x40 & 1) != 0) {
    plVar1 = (lys_module *)plVar1->data;
  }
  lys_switch_deviation(dev,module);
  plVar2 = ly_ctx_get_module_iter(module->ctx,local_34);
  do {
    if (plVar2 == (lys_module *)0x0) {
      plVar1->field_0x40 = plVar1->field_0x40 & 0xcf;
      return;
    }
    if ((plVar2 != module) && (plVar2 != plVar1)) {
      uVar6 = (ulong)plVar2->deviation_size;
      bVar9 = uVar6 != 0;
      if (bVar9) {
        plVar7 = plVar2->deviation;
        __needle = plVar1->name;
        uVar8 = 1;
        do {
          pcVar3 = strstr(plVar7->target_name,__needle);
          if ((pcVar3 != (char *)0x0) && (sVar4 = strlen(__needle), pcVar3[sVar4] == ':')) {
            if (bVar9) {
              return;
            }
            break;
          }
          bVar9 = uVar8 < uVar6;
          plVar7 = plVar7 + 1;
          bVar10 = uVar8 != uVar6;
          uVar8 = uVar8 + 1;
        } while (bVar10);
      }
    }
    plVar2 = ly_ctx_get_module_iter(module->ctx,local_34);
  } while( true );
}

Assistant:

static void
remove_dev(struct lys_deviation *dev, const struct lys_module *module)
{
    uint32_t idx = 0, j;
    const struct lys_module *mod;
    struct lys_module *target_mod;
    const char *ptr;

    if (dev->orig_node) {
        target_mod = lys_node_module(dev->orig_node);
    } else {
        LOGINT;
        return;
    }
    lys_switch_deviation(dev, module);

    /* clear the deviation flag if possible */
    while ((mod = ly_ctx_get_module_iter(module->ctx, &idx))) {
        if ((mod == module) || (mod == target_mod)) {
            continue;
        }

        for (j = 0; j < mod->deviation_size; ++j) {
            ptr = strstr(mod->deviation[j].target_name, target_mod->name);
            if (ptr && (ptr[strlen(target_mod->name)] == ':')) {
                /* some other module deviation targets the inspected module, flag remains */
                break;
            }
        }

        if (j < mod->deviation_size) {
            break;
        }
    }

    if (!mod) {
        target_mod->deviated = 0;
    }
}